

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

size_t DepParserTask::transition_eager
                 (search *sch,uint64_t a_id,uint32_t idx,uint32_t t_id,uint32_t n)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined8 uVar4;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  search *in_RDI;
  uint in_R8D;
  stringstream __msg;
  uint32_t hd_1;
  size_t last_1;
  uint32_t last;
  uint32_t hd;
  v_array<unsigned_int> *children;
  v_array<unsigned_int> *tags;
  v_array<unsigned_int> *gold_tags;
  v_array<unsigned_int> *gold_heads;
  v_array<unsigned_int> *stack;
  v_array<unsigned_int> *heads;
  task_data *data;
  uint *in_stack_fffffffffffffd68;
  float fVar5;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined8 in_stack_fffffffffffffd90;
  int plineNumber;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  stringstream local_200 [16];
  ostream local_1f0;
  uint local_74;
  ulong local_70;
  uint local_68;
  uint local_64;
  v_array<unsigned_int> *local_60;
  v_array<unsigned_int> *local_58;
  v_array<unsigned_int> *local_50;
  v_array<unsigned_int> *local_48;
  v_array<unsigned_int> *local_40;
  v_array<unsigned_int> *local_38;
  task_data *local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  ulong local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_30 = Search::search::get_task_data<task_data>(in_RDI);
  local_38 = &local_30->heads;
  local_40 = &local_30->stack;
  local_48 = &local_30->gold_heads;
  local_50 = &local_30->gold_tags;
  local_58 = &local_30->tags;
  local_60 = local_30->children;
  if (local_18 == 1) {
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    local_8 = (ulong)(local_1c + 1);
  }
  else if (local_18 == 2) {
    local_64 = v_array<unsigned_int>::last(local_40);
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    uVar2 = local_64;
    fVar5 = (float)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    local_68 = local_1c;
    puVar3 = v_array<unsigned_int>::operator[](local_38,(ulong)local_1c);
    *puVar3 = uVar2;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 4,(ulong)local_64);
    uVar2 = *puVar3;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 5,(ulong)local_64);
    uVar1 = local_68;
    *puVar3 = uVar2;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 4,(ulong)local_64);
    *puVar3 = uVar1;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 1,(ulong)local_64);
    *puVar3 = *puVar3 + 1;
    puVar3 = v_array<unsigned_int>::operator[](local_58,(ulong)local_68);
    *puVar3 = local_20;
    puVar3 = v_array<unsigned_int>::operator[](local_48,(ulong)local_68);
    uVar2 = *puVar3;
    puVar3 = v_array<unsigned_int>::operator[](local_38,(ulong)local_68);
    if (uVar2 == *puVar3) {
      v_array<unsigned_int>::operator[](local_50,(ulong)local_68);
    }
    Search::search::loss
              ((search *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),fVar5);
    local_8 = (ulong)(local_1c + 1);
  }
  else if (local_18 == 3) {
    uVar2 = v_array<unsigned_int>::last(local_40);
    fVar5 = (float)((ulong)in_stack_fffffffffffffd68 >> 0x20);
    local_70 = (ulong)uVar2;
    uVar2 = local_1c;
    if (local_24 < local_1c) {
      uVar2 = 0;
    }
    local_74 = uVar2;
    puVar3 = v_array<unsigned_int>::operator[](local_38,local_70);
    *puVar3 = uVar2;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 2,(ulong)local_74);
    uVar2 = *puVar3;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 3,(ulong)local_74);
    *puVar3 = uVar2;
    uVar2 = (uint)local_70;
    puVar3 = v_array<unsigned_int>::operator[](local_60 + 2,(ulong)local_74);
    *puVar3 = uVar2;
    puVar3 = v_array<unsigned_int>::operator[](local_60,(ulong)local_74);
    *puVar3 = *puVar3 + 1;
    puVar3 = v_array<unsigned_int>::operator[](local_58,local_70);
    *puVar3 = local_20;
    puVar3 = v_array<unsigned_int>::operator[](local_48,local_70);
    uVar2 = *puVar3;
    puVar3 = v_array<unsigned_int>::operator[](local_38,local_70);
    if (uVar2 == *puVar3) {
      v_array<unsigned_int>::operator[](local_50,local_70);
      in_stack_fffffffffffffd74 = 0;
    }
    Search::search::loss
              ((search *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),fVar5);
    v_array<unsigned_int>::pop(local_40);
    local_8 = (ulong)local_1c;
  }
  else {
    if (local_18 != 4) {
      std::__cxx11::stringstream::stringstream(local_200);
      std::operator<<(&local_1f0,"transition_eager failed");
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                ((vw_exception *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),plineNumber,
                 (string *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    v_array<unsigned_int>::pop(local_40);
    local_8 = (ulong)local_1c;
  }
  return local_8;
}

Assistant:

size_t transition_eager(Search::search &sch, uint64_t a_id, uint32_t idx, uint32_t t_id, uint32_t n)
{
  task_data *data = sch.get_task_data<task_data>();
  v_array<uint32_t> &heads = data->heads, &stack = data->stack, &gold_heads = data->gold_heads,
                    &gold_tags = data->gold_tags, &tags = data->tags;
  v_array<uint32_t> *children = data->children;
  if (a_id == SHIFT)
  {
    stack.push_back(idx);
    return idx + 1;
  }
  else if (a_id == REDUCE_RIGHT)
  {
    uint32_t hd = stack.last();
    stack.push_back(idx);
    uint32_t last = idx;
    heads[last] = hd;
    children[5][hd] = children[4][hd];
    children[4][hd] = last;
    children[1][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    return idx + 1;
  }
  else if (a_id == REDUCE_LEFT)
  {
    size_t last = stack.last();
    uint32_t hd = (idx > n) ? 0 : idx;
    heads[last] = hd;
    children[3][hd] = children[2][hd];
    children[2][hd] = (uint32_t)last;
    children[0][hd]++;
    tags[last] = t_id;
    sch.loss(gold_heads[last] != heads[last] ? 2 : (gold_tags[last] != t_id) ? 1.f : 0.f);
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  else if (a_id == REDUCE)
  {
    assert(!stack.empty());
    stack.pop();
    return idx;
  }
  THROW("transition_eager failed");
}